

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::VertexCubeTextureCase::deinit(VertexCubeTextureCase *this)

{
  TextureCube *this_00;
  ShaderProgram *this_01;
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    this_00 = this->m_textures[lVar1];
    if (this_00 != (TextureCube *)0x0) {
      glu::TextureCube::~TextureCube(this_00);
      operator_delete(this_00,0x180);
    }
    this->m_textures[lVar1] = (TextureCube *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  this_01 = this->m_program;
  if (this_01 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_01);
    operator_delete(this_01,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void VertexCubeTextureCase::deinit (void)
{
	for (int i = 0; i < 2; i++)
	{
		delete m_textures[i];
		m_textures[i] = DE_NULL;
	}

	delete m_program;
	m_program = DE_NULL;
}